

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O2

Float<unsigned_int,_8,_23,_127,_3U>
tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,5,15,2u>
          (Float<unsigned_int,_5,_5,_15,_2U> *other)

{
  uint uVar1;
  StorageType SVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = other->m_value;
  if ((uVar1 & 0x3ff) == 0x3e0) {
    uVar5 = 0xff800000;
    if ((uVar1 >> 10 & 1) == 0) {
      uVar5 = 0x7f800000;
    }
  }
  else {
    uVar5 = 0x7fffffff;
    if (((~uVar1 & 0x3e0) != 0 || (uVar1 & 0x1f) == 0) &&
       (uVar5 = uVar1 << 0x15, (uVar1 & 0x3ff) != 0)) {
      uVar1 = Float<unsigned_int,_5,_5,_15,_2U>::exponent(other);
      SVar2 = Float<unsigned_int,_5,_5,_15,_2U>::mantissa(other);
      uVar3 = uVar1 * 0x800000 + 0x3f800000;
      for (uVar4 = (ulong)SVar2; (uVar4 & 0x20) == 0; uVar4 = uVar4 * 2) {
        uVar1 = uVar1 - 1;
        uVar3 = uVar3 - 0x800000;
      }
      if ((int)uVar1 < -0x7e) {
        if (uVar1 < 0xffffff6a) {
          uVar5 = (other->m_value & 0x400) << 0x15;
        }
        else {
          uVar5 = uVar5 & 0x80000000 |
                  (uint)(~(-1L << (0x6fU - (char)uVar1 & 0x3f)) + uVar4 +
                         (ulong)((uVar4 >> ((ulong)(-uVar1 - 0x90) & 0x3f) & 1) != 0) >>
                        ((byte)(-uVar1 - 0x90) & 0x3f));
        }
      }
      else if ((int)uVar1 < 0x80) {
        uVar5 = uVar3 | uVar5 & 0x80000000 | ((uint)uVar4 & 0xffffffdf) << 0x12;
      }
      else {
        uVar5 = 0xff800000;
        if ((other->m_value & 0x400) == 0) {
          uVar5 = 0x7f800000;
        }
      }
    }
  }
  return (Float<unsigned_int,_8,_23,_127,_3U>)uVar5;
}

Assistant:

inline int				sign			(void) const	{ return signBit() ? -1 : 1;																			}